

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

void sx_fiber_stack_init_ptr(sx_fiber_stack *fstack,void *ptr,uint size)

{
  code *pcVar1;
  size_t sVar2;
  size_t page_sz;
  uint size_local;
  void *ptr_local;
  sx_fiber_stack *fstack_local;
  
  sVar2 = sx_os_pagesz();
  if ((ulong)ptr % sVar2 != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0x4b,"buffer size must be dividable to OS page size");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if ((ulong)size % sVar2 != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0x4c,"buffer size must be dividable to OS page size");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  fstack->sptr = ptr;
  fstack->ssize = size;
  return;
}

Assistant:

void sx_fiber_stack_init_ptr(sx_fiber_stack* fstack, void* ptr, unsigned int size)
{
    size_t page_sz = sx_os_pagesz();
    sx_unused(page_sz);
    sx_assertf((uintptr_t)ptr % page_sz == 0, "buffer size must be dividable to OS page size");
    sx_assertf(size % page_sz == 0, "buffer size must be dividable to OS page size");

    fstack->sptr = ptr;
    fstack->ssize = size;
}